

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutualInformation.cpp
# Opt level: O0

void __thiscall
MutualInformation::MutualInformation(MutualInformation *this,shared_ptr<Launcher> *launcher)

{
  undefined8 *in_RDI;
  Launcher *in_stack_ffffffffffffff88;
  Application *in_stack_ffffffffffffff90;
  shared_ptr<QueryCompiler> *this_00;
  shared_ptr<QueryCompiler> local_20 [2];
  
  Application::Application(in_stack_ffffffffffffff90);
  *in_RDI = &PTR__MutualInformation_0037fb30;
  std::__cxx11::string::string((string *)(in_RDI + 10));
  std::shared_ptr<QueryCompiler>::shared_ptr((shared_ptr<QueryCompiler> *)0x254dd2);
  std::shared_ptr<TreeDecomposition>::shared_ptr((shared_ptr<TreeDecomposition> *)0x254de5);
  in_RDI[0x12] = 0;
  std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x254dff);
  Launcher::getCompiler(in_stack_ffffffffffffff88);
  this_00 = local_20;
  std::shared_ptr<QueryCompiler>::operator=
            (this_00,(shared_ptr<QueryCompiler> *)in_stack_ffffffffffffff88);
  std::shared_ptr<QueryCompiler>::~shared_ptr((shared_ptr<QueryCompiler> *)0x254e30);
  std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x254e3a);
  Launcher::getTreeDecomposition(in_stack_ffffffffffffff88);
  std::shared_ptr<TreeDecomposition>::operator=
            ((shared_ptr<TreeDecomposition> *)this_00,
             (shared_ptr<TreeDecomposition> *)in_stack_ffffffffffffff88);
  std::shared_ptr<TreeDecomposition>::~shared_ptr((shared_ptr<TreeDecomposition> *)0x254e69);
  return;
}

Assistant:

MutualInformation::MutualInformation(shared_ptr<Launcher> launcher)
{
    _compiler = launcher->getCompiler();
    _td = launcher->getTreeDecomposition();
}